

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O0

char * nng_str_sockaddr(nng_sockaddr *sa,char *buf,size_t bufsz)

{
  size_t bufsz_local;
  char *buf_local;
  nng_sockaddr *sa_local;
  
  switch(sa->s_family) {
  case 0:
  default:
    sa_local = (nng_sockaddr *)anon_var_dwarf_ff35;
    break;
  case 1:
    sa_local = (nng_sockaddr *)str_sa_inproc(&sa->s_inproc,buf,bufsz);
    break;
  case 2:
    sa_local = (nng_sockaddr *)str_sa_ipc(&sa->s_ipc,buf,bufsz);
    break;
  case 3:
    sa_local = (nng_sockaddr *)str_sa_inet(&sa->s_in,buf,bufsz);
    break;
  case 4:
    sa_local = (nng_sockaddr *)str_sa_inet6(&sa->s_in6,buf,bufsz);
    break;
  case 5:
    sa_local = (nng_sockaddr *)str_sa_abstract(&sa->s_abstract,buf,bufsz);
  }
  return (char *)sa_local;
}

Assistant:

const char *
nng_str_sockaddr(const nng_sockaddr *sa, char *buf, size_t bufsz)
{
	switch (sa->s_family) {
	case NNG_AF_INPROC:
		return (str_sa_inproc(&sa->s_inproc, buf, bufsz));
	case NNG_AF_INET:
		return (str_sa_inet(&sa->s_in, buf, bufsz));
	case NNG_AF_INET6:
		return (str_sa_inet6(&sa->s_in6, buf, bufsz));
	case NNG_AF_IPC:
		return (str_sa_ipc(&sa->s_ipc, buf, bufsz));
	case NNG_AF_ABSTRACT:
		return (str_sa_abstract(&sa->s_abstract, buf, bufsz));
	case NNG_AF_UNSPEC:
	default:
		return ("unknown");
	}
}